

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::EntryPointInfo::ProcessJitTransferData(EntryPointInfo *this)

{
  JitTransferData *pJVar1;
  code *pcVar2;
  State SVar3;
  bool bVar4;
  undefined4 *puVar5;
  NativeEntryPointData *pNVar6;
  ScriptContext *scriptContext;
  AutoCleanup local_28;
  AutoCleanup autoCleanup;
  
  SVar3 = GetState(this);
  if (SVar3 == CleanedUp) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2089,"(!IsCleanedUp())","!IsCleanedUp()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pNVar6 = GetNativeEntryPointData(this);
  pJVar1 = (pNVar6->jitTransferData).ptr;
  if (pJVar1 != (JitTransferData *)0x0) {
    local_28.entryPointInfo = this;
    scriptContext = GetScriptContext(this);
    if (pJVar1->isReady == true) {
      PinTypeRefs(this,scriptContext);
      InstallGuards(this,scriptContext);
    }
    FreeJitTransferData(this);
    local_28.entryPointInfo = (EntryPointInfo *)0x0;
    ProcessJitTransferData::AutoCleanup::~AutoCleanup(&local_28);
  }
  return;
}

Assistant:

void EntryPointInfo::ProcessJitTransferData()
    {
        Assert(!IsCleanedUp());

        auto jitTransferData = GetJitTransferData();
        if (jitTransferData == nullptr)
        {
            return;
        }

        class AutoCleanup
        {
            EntryPointInfo *entryPointInfo;
        public:
            AutoCleanup(EntryPointInfo *entryPointInfo) : entryPointInfo(entryPointInfo)
            {
            }

            void Done()
            {
                entryPointInfo = nullptr;
            }
            ~AutoCleanup()
            {
                if (entryPointInfo)
                {
                    entryPointInfo->OnNativeCodeInstallFailure();
                }
            }
        } autoCleanup(this);


        ScriptContext* scriptContext = GetScriptContext();

        if (jitTransferData->GetIsReady())
        {
            PinTypeRefs(scriptContext);
            InstallGuards(scriptContext);
        }

        FreeJitTransferData();

        autoCleanup.Done();
    }